

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void corruptSchema(InitData *pData,char *zObj,char *zExtra)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  char *local_30;
  char *z;
  sqlite3 *db;
  char *zExtra_local;
  char *zObj_local;
  InitData *pData_local;
  
  db_00 = pData->db;
  if (db_00->mallocFailed == '\0') {
    if (*pData->pzErrMsg == (char *)0x0) {
      if ((pData->mInitFlags & 1) == 0) {
        if ((db_00->flags & 1) == 0) {
          zExtra_local = zObj;
          if (zObj == (char *)0x0) {
            zExtra_local = "?";
          }
          local_30 = sqlite3MPrintf(db_00,"malformed database schema (%s)",zExtra_local);
          if ((zExtra != (char *)0x0) && (*zExtra != '\0')) {
            local_30 = sqlite3MPrintf(db_00,"%z - %s",local_30,zExtra);
          }
          *pData->pzErrMsg = local_30;
          iVar1 = sqlite3CorruptError(0x1e354);
          pData->rc = iVar1;
        }
        else {
          iVar1 = sqlite3CorruptError(0x1e34d);
          pData->rc = iVar1;
        }
      }
      else {
        pcVar2 = sqlite3DbStrDup(db_00,zExtra);
        *pData->pzErrMsg = pcVar2;
        pData->rc = 1;
      }
    }
  }
  else {
    pData->rc = 7;
  }
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  const char *zObj,    /* Object being parsed at the point of error */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & INITFLAG_AlterTable ){
    *pData->pzErrMsg = sqlite3DbStrDup(db, zExtra);
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    if( zObj==0 ) zObj = "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}